

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

bool __thiscall MT32Emu::Synth::initPCMList(Synth *this,Bit16u mapAddress,Bit16u count)

{
  long lVar1;
  byte bVar2;
  PCMWaveEntry *pPVar3;
  Bit32u BVar4;
  undefined6 in_register_00000012;
  ulong uVar5;
  undefined6 in_register_00000032;
  uint uVar6;
  undefined8 in_R9;
  long lVar7;
  Bit8u *pBVar8;
  bool bVar9;
  
  if ((int)CONCAT62(in_register_00000012,count) != 0) {
    pBVar8 = this->controlROMData + (CONCAT62(in_register_00000032,mapAddress) & 0xffffffff);
    lVar1 = (ulong)count * 6 + -6;
    uVar5 = 0;
    lVar7 = 0;
    do {
      bVar2 = pBVar8[1];
      uVar6 = 0x800 << (bVar2 >> 4 & 7);
      BVar4 = (Bit32u)((ulong)*pBVar8 << 0xb);
      if (this->pcmROMSize < (ulong)(uVar6 + BVar4)) {
        printDebug(this,
                   "Control ROM error: Wave map entry %d points to invalid PCM address 0x%04X, length 0x%04X"
                   ,uVar5,(ulong)*pBVar8 << 0xb,(ulong)uVar6,in_R9,lVar1);
        return false;
      }
      pPVar3 = this->pcmWaves;
      (&pPVar3->addr)[lVar7] = BVar4;
      (&pPVar3->len)[lVar7] = uVar6;
      (&pPVar3->loop)[lVar7 * 4] = (bool)(bVar2 >> 7);
      *(Bit8u **)((long)&pPVar3->controlROMPCMStruct + lVar7 * 4) = pBVar8;
      uVar5 = (ulong)((int)uVar5 + 1);
      pBVar8 = pBVar8 + 4;
      bVar9 = lVar1 != lVar7;
      lVar7 = lVar7 + 6;
    } while (bVar9);
  }
  return false;
}

Assistant:

bool Synth::initPCMList(Bit16u mapAddress, Bit16u count) {
	ControlROMPCMStruct *tps = reinterpret_cast<ControlROMPCMStruct *>(&controlROMData[mapAddress]);
	for (int i = 0; i < count; i++) {
		Bit32u rAddr = tps[i].pos * 0x800;
		Bit32u rLenExp = (tps[i].len & 0x70) >> 4;
		Bit32u rLen = 0x800 << rLenExp;
		if (rAddr + rLen > pcmROMSize) {
			printDebug("Control ROM error: Wave map entry %d points to invalid PCM address 0x%04X, length 0x%04X", i, rAddr, rLen);
			return false;
		}
		pcmWaves[i].addr = rAddr;
		pcmWaves[i].len = rLen;
		pcmWaves[i].loop = (tps[i].len & 0x80) != 0;
		pcmWaves[i].controlROMPCMStruct = &tps[i];
		//int pitch = (tps[i].pitchMSB << 8) | tps[i].pitchLSB;
		//bool unaffectedByMasterTune = (tps[i].len & 0x01) == 0;
		//printDebug("PCM %d: pos=%d, len=%d, pitch=%d, loop=%s, unaffectedByMasterTune=%s", i, rAddr, rLen, pitch, pcmWaves[i].loop ? "YES" : "NO", unaffectedByMasterTune ? "YES" : "NO");
	}
	return false;
}